

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerMSL::declare_undefined_values(CompilerMSL *this)

{
  uint uVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  SPIRUndef *pSVar5;
  SPIRType *pSVar6;
  undefined1 *extraout_RAX;
  undefined1 *puVar7;
  long lVar8;
  LoopLock local_80;
  ulong local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[0xc].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 == 0) {
    ParsedIR::LoopLock::~LoopLock(&local_80);
  }
  else {
    pTVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[0xc].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar8 = 0;
    local_78 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar8);
      pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeUndef) {
        pSVar5 = Variant::get<spirv_cross::SPIRUndef>(pVVar4 + uVar1);
        pSVar6 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(pSVar5->super_IVariant).field_0xc);
        if (*(int *)&(pSVar6->super_IVariant).field_0xc != 1) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (local_70,this,(ulong)(pSVar5->super_IVariant).self.id,1);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
                    (&local_50,this,pSVar6,local_70,(ulong)(pSVar5->super_IVariant).self.id);
          CompilerGLSL::statement<char_const(&)[10],std::__cxx11::string,char_const(&)[7]>
                    (&this->super_CompilerGLSL,(char (*) [10])"constant ",&local_50,
                     (char (*) [7])" = {};");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          puVar7 = local_60;
          if (local_70[0] != puVar7) {
            operator_delete(local_70[0]);
            puVar7 = extraout_RAX;
          }
          local_78 = CONCAT71((int7)((ulong)puVar7 >> 8),1);
        }
      }
      lVar8 = lVar8 + 4;
    } while (sVar2 << 2 != lVar8);
    ParsedIR::LoopLock::~LoopLock(&local_80);
    if ((local_78 & 1) != 0) {
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2dc0a8);
    }
  }
  return;
}

Assistant:

void CompilerMSL::declare_undefined_values()
{
	bool emitted = false;
	ir.for_each_typed_id<SPIRUndef>([&](uint32_t, SPIRUndef &undef) {
		auto &type = this->get<SPIRType>(undef.basetype);
		// OpUndef can be void for some reason ...
		if (type.basetype == SPIRType::Void)
			return;

		statement("constant ", variable_decl(type, to_name(undef.self), undef.self), " = {};");
		emitted = true;
	});

	if (emitted)
		statement("");
}